

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O1

char16 * __thiscall
FunctionJITTimeInfo::GetDebugNumberSet(FunctionJITTimeInfo *this,wchar (*bufferToWriteTo) [42])

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  
  uVar4 = GetSourceContextId(this);
  uVar1 = (this->m_data).localFuncId;
  uVar5 = JITTimeFunctionBody::GetFunctionNumber((JITTimeFunctionBody *)(this->m_data).bodyData);
  iVar6 = swprintf_s((char16_t_conflict *)bufferToWriteTo,0x2a,
                     (char16_t_conflict *)L" (#%d.%u), #%u",(ulong)uVar4,(ulong)uVar1,(ulong)uVar5);
  if (iVar6 < 9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x1ea,"(len > 8)","len > 8");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return *bufferToWriteTo;
}

Assistant:

char16*
FunctionJITTimeInfo::GetDebugNumberSet(wchar(&bufferToWriteTo)[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE]) const
{
    // (#%u.%u), #%u --> (source file Id . function Id) , function Number
    int len = swprintf_s(bufferToWriteTo, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u(" (#%d.%u), #%u"),
        (int)GetSourceContextId(), GetLocalFunctionId(), GetBody()->GetFunctionNumber());
    Assert(len > 8);
    return bufferToWriteTo;
}